

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

pointer __thiscall
slang::SmallVectorBase<slang::SourceLocation>::emplaceRealloc<slang::SourceLocation_const&>
          (SmallVectorBase<slang::SourceLocation> *this,pointer pos,SourceLocation *args)

{
  ulong uVar1;
  SourceLocation *p;
  pointer pSVar2;
  SourceLocation *pSVar3;
  SourceLocation *pSVar4;
  SourceLocation *pSVar5;
  long lVar6;
  long lVar7;
  size_type sVar8;
  ulong uVar9;
  
  if (this->len == 0xfffffffffffffff) {
    detail::throwLengthError();
  }
  uVar9 = this->len + 1;
  uVar1 = this->cap;
  if (uVar9 < uVar1 * 2) {
    uVar9 = uVar1 * 2;
  }
  if (0xfffffffffffffff - uVar1 < uVar1) {
    uVar9 = 0xfffffffffffffff;
  }
  lVar7 = (long)pos - (long)this->data_;
  pSVar3 = (SourceLocation *)operator_new(uVar9 * 8);
  *(SourceLocation *)((long)pSVar3 + lVar7) = *args;
  p = this->data_;
  sVar8 = this->len;
  lVar6 = (long)p + (sVar8 * 8 - (long)pos);
  pSVar2 = p;
  pSVar4 = pSVar3;
  if (lVar6 == 0) {
    pSVar5 = p;
    if (sVar8 != 0) {
      do {
        *pSVar4 = *pSVar5;
        pSVar5 = pSVar5 + 1;
        pSVar4 = pSVar4 + 1;
      } while (pSVar5 != pos);
    }
  }
  else {
    for (; pSVar2 != pos; pSVar2 = pSVar2 + 1) {
      *pSVar4 = *pSVar2;
      pSVar4 = pSVar4 + 1;
    }
    memcpy((void *)((long)pSVar3 + lVar7 + 8),pos,(lVar6 - 8U & 0xfffffffffffffff8) + 8);
  }
  if (p != (SourceLocation *)this->firstElement) {
    operator_delete(p);
    sVar8 = this->len;
  }
  this->len = sVar8 + 1;
  this->cap = uVar9;
  this->data_ = pSVar3;
  return (pointer)((long)pSVar3 + lVar7);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}